

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::input_read(Graph *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  int local_2a4;
  int local_2a0;
  int i_1;
  int n_edges;
  int i;
  int num_nos;
  int destinyId;
  int originId;
  int vertexId;
  int n_col_e;
  int n_col_v;
  string aux;
  istream local_250 [8];
  ifstream input;
  double local_48;
  double voltage;
  double reactive_power;
  double reactance;
  double resistance;
  double power;
  string *psStack_18;
  int edgeId;
  string *name_local;
  Graph *this_local;
  
  psStack_18 = name;
  name_local = (string *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  power._4_4_ = 0;
  std::ifstream::ifstream(local_250);
  std::ifstream::open(local_250,name,8);
  std::__cxx11::string::string((string *)&n_col_e);
  vertexId = 0xd;
  originId = 0xc;
  while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&n_col_e,"Vb"), bVar1) {
    std::operator>>(local_250,(string *)&n_col_e);
  }
  std::operator>>(local_250,(string *)&n_col_e);
  std::istream::operator>>(local_250,&this->VB);
  std::operator>>(local_250,(string *)&n_col_e);
  std::operator>>(local_250,(string *)&n_col_e);
  std::istream::operator>>(local_250,&this->PB);
  std::operator>>(local_250,(string *)&n_col_e);
  std::operator>>(local_250,(string *)&n_col_e);
  std::istream::operator>>(local_250,&this->ZB);
  std::ifstream::close();
  std::ifstream::open(local_250,name,8);
  do {
    std::operator>>(local_250,(string *)&n_col_e);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &n_col_e,"num_nos");
  } while (bVar1);
  std::istream::operator>>(local_250,&n_edges);
  for (i_1 = 1; i_1 <= n_edges * vertexId; i_1 = i_1 + 1) {
    if (i_1 % vertexId == 1) {
      std::istream::operator>>(local_250,&destinyId);
    }
    else if (i_1 % vertexId == 4) {
      std::istream::operator>>(local_250,&local_48);
    }
    else if (i_1 % vertexId == 10) {
      std::istream::operator>>(local_250,&resistance);
      resistance = this->mw_factor * (resistance / this->PB);
    }
    else if (i_1 % vertexId == 0xb) {
      std::istream::operator>>(local_250,&voltage);
      voltage = (voltage / this->PB) * this->mw_factor;
      insertVertex(this,destinyId,resistance,voltage,local_48,1);
    }
    else {
      std::operator>>(local_250,(string *)&n_col_e);
    }
  }
  do {
    std::operator>>(local_250,(string *)&n_col_e);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &n_col_e,"num_arestas");
  } while (bVar1);
  std::istream::operator>>(local_250,&local_2a0);
  for (local_2a4 = 1; local_2a4 <= local_2a0 * originId; local_2a4 = local_2a4 + 1) {
    if (local_2a4 % originId == 1) {
      std::istream::operator>>(local_250,&num_nos);
    }
    else if (local_2a4 % originId == 2) {
      std::istream::operator>>(local_250,&i);
    }
    else if (local_2a4 % originId == 3) {
      std::istream::operator>>(local_250,&reactance);
      reactance = reactance / this->ZB;
    }
    else if (local_2a4 % originId == 4) {
      std::istream::operator>>(local_250,&reactive_power);
      reactive_power = reactive_power / this->ZB;
      power._4_4_ = power._4_4_ + 1;
      insertEdge(this,num_nos,i,power._4_4_,reactance,reactive_power,false);
      insertEdge(this,i,num_nos,power._4_4_,reactance,reactive_power,false);
    }
    else {
      std::operator>>(local_250,(string *)&n_col_e);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\n");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2," lida!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&n_col_e);
  std::ifstream::~ifstream(local_250);
  return;
}

Assistant:

void Graph::input_read( string name ){

    cout << name << endl;
    int edgeId = 0;
    double power, resistance, reactance, reactive_power, voltage;

    ifstream input;
    input.open(name);

    string aux;

    int n_col_v = 13, n_col_e = 12; //numero de colunas do arquivo de entradaz
    while(aux != "Vb") input >> aux;

    input >> aux;
    input >> VB;
    input >> aux;input >> aux;
    input >> PB;
    input >> aux;input >> aux;
    input >> ZB;

    input.close();
    input.open(name);
    int vertexId, originId, destinyId;

    do{
        input >> aux;
    }while(aux != "num_nos");///pula lixo ate chegar na parte de informacoes do no

    int num_nos;
    input >> num_nos;
    for(int i=1 ; i<=num_nos*n_col_v; i++){
        if(i % n_col_v == 1){
            input >> vertexId;
        }
        else if(i % n_col_v == 4){
            input >> voltage;
        }
        else if(i % n_col_v == 10){
            input >> power;
            power /= PB;
            power *= mw_factor;
        }
        else if(i % n_col_v == 11){
            input >> reactive_power;
            reactive_power /=PB;
            reactive_power *= mw_factor;
            insertVertex(vertexId, power, reactive_power, voltage);
        }
        else
            input >> aux;
    }

    do{
        input >> aux;
    }while(aux != "num_arestas");

    int n_edges;
    input >> n_edges;

    for(int i=1 ; i<=n_edges*n_col_e; i++){
        if(i % n_col_e == 1){
            input >> originId;
        }
        else if(i % n_col_e == 2){
            input >> destinyId;
        }
        else if(i % n_col_e == 3){
            input >> resistance;
            resistance /= ZB;
        }
        else if(i % n_col_e == 4){
            input >> reactance;
            reactance /= ZB;

            edgeId++;
            insertEdge(originId, destinyId, edgeId, resistance, reactance, false);
            insertEdge(destinyId, originId, edgeId, resistance, reactance, false);
        }
        else
            input >> aux;
    }
    cout << "\n" << name << " lida!" << endl;
}